

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyImplPrivate::metaDataChanged(QNetworkReplyImplPrivate *this)

{
  QNetworkReply *this_00;
  Data *pDVar1;
  int iVar2;
  QNetworkCookieJar *pQVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QArrayDataPointer<QNetworkCookie> local_b8;
  _Storage<QList<QNetworkCookie>,_false> local_98;
  undefined1 *puStack_80;
  undefined1 local_78 [32];
  QVariant local_58;
  QObject *local_38;
  
  local_38 = *(QObject **)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  pDVar1 = (this->super_QNetworkReplyPrivate).manager.wp.d;
  if (((pDVar1 != (Data *)0x0) && ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0))
     && ((this->super_QNetworkReplyPrivate).manager.wp.value != (QObject *)0x0)) {
    local_98._M_value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._M_value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98._M_value.d.ptr = (QNetworkCookie *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)local_78);
    QHttpHeaders::values((QList<QByteArray> *)&local_58,(QHttpHeaders *)local_78,SetCookie);
    QNetworkHeadersPrivate::toSetCookieList
              ((optional<QList<QNetworkCookie>_> *)&local_98._M_value,(QList<QByteArray> *)&local_58
              );
    QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_58);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)local_78);
    if ((char)puStack_80 == '\x01') {
      local_b8.d = local_98._M_value.d.d;
      local_b8.ptr = local_98._M_value.d.ptr;
      local_b8.size = local_98._M_value.d.size;
      if (local_98._M_value.d.d != (Data *)0x0) {
        LOCK();
        ((local_98._M_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98._M_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
    }
    else {
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (QNetworkCookie *)0x0;
      local_b8.size = 0;
    }
    local_58.d.data._16_8_ = (Data *)0x0;
    local_58.d.data._8_8_ = (Data *)0x0;
    local_58.d.data.shared = (PrivateShared *)0x0;
    QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer
              ((QArrayDataPointer<QNetworkCookie> *)&local_58);
    if ((undefined1 *)local_b8.size == (undefined1 *)0x0) {
      bVar4 = false;
    }
    else {
      QVariant::QVariant((QVariant *)local_78,0);
      QNetworkRequest::attribute
                (&local_58,&(this->super_QNetworkReplyPrivate).request,CookieSaveControlAttribute,
                 (QVariant *)local_78);
      iVar2 = QVariant::toInt((bool *)&local_58);
      bVar4 = iVar2 == 0;
      QVariant::~QVariant(&local_58);
      QVariant::~QVariant((QVariant *)local_78);
    }
    if ((bVar4) &&
       (pQVar3 = QNetworkAccessManager::cookieJar
                           ((QNetworkAccessManager *)
                            (this->super_QNetworkReplyPrivate).manager.wp.value),
       pQVar3 != (QNetworkCookieJar *)0x0)) {
      (**(code **)(*(long *)pQVar3 + 0x68))
                (pQVar3,&local_b8,&(this->super_QNetworkReplyPrivate).url);
    }
    QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer(&local_b8);
    if ((char)puStack_80 == '\x01') {
      puStack_80 = (undefined1 *)((ulong)puStack_80 & 0xffffffffffffff00);
      QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer(&local_98._M_value.d);
    }
  }
  QNetworkReply::metaDataChanged(this_00);
  if (*(QObject **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::metaDataChanged()
{
    Q_Q(QNetworkReplyImpl);
    // 1. do we have cookies?
    // 2. are we allowed to set them?
    if (!manager.isNull()) {
        const auto cookiesOpt = QNetworkHeadersPrivate::toSetCookieList(
                headers().values(QHttpHeaders::WellKnownHeader::SetCookie));
        const auto cookies = cookiesOpt.value_or(QList<QNetworkCookie>());
        if (!cookies.empty()
            && request.attribute(QNetworkRequest::CookieSaveControlAttribute,
                                 QNetworkRequest::Automatic).toInt() == QNetworkRequest::Automatic) {
            QNetworkCookieJar *jar = manager->cookieJar();
            if (jar) {
                jar->setCookiesFromUrl(cookies, url);
            }
        }
    }

    emit q->metaDataChanged();
}